

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  ExtendsClauseSyntax *pEVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_2;
  ArgumentListSyntax *local_38;
  DefaultExtendsClauseArgSyntax *local_30;
  Token local_28;
  
  local_28 = parsing::Token::deepClone((Token *)(__fn + 0x18),(BumpAllocator *)__child_stack);
  args_1 = detail::
           visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                     (*(SyntaxNode **)(__fn + 0x28),(DeepCloneVisitor *)&local_38,
                      (BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x30) == (SyntaxNode *)0x0) {
    local_38 = (ArgumentListSyntax *)0x0;
  }
  else {
    local_38 = (ArgumentListSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x30),(DeepCloneVisitor *)&local_38,
                          (BumpAllocator *)__child_stack);
  }
  if (*(SyntaxNode **)(__fn + 0x38) == (SyntaxNode *)0x0) {
    local_30 = (DefaultExtendsClauseArgSyntax *)0x0;
  }
  else {
    local_30 = (DefaultExtendsClauseArgSyntax *)
               detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x38),(DeepCloneVisitor *)&local_30,
                          (BumpAllocator *)__child_stack);
  }
  pEVar1 = BumpAllocator::
           emplace<slang::syntax::ExtendsClauseSyntax,slang::parsing::Token,slang::syntax::NameSyntax&,slang::syntax::ArgumentListSyntax*,slang::syntax::DefaultExtendsClauseArgSyntax*>
                     ((BumpAllocator *)__child_stack,&local_28,(NameSyntax *)args_1,&local_38,
                      &local_30);
  return (int)pEVar1;
}

Assistant:

static SyntaxNode* clone(const ExtendsClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ExtendsClauseSyntax>(
        node.keyword.deepClone(alloc),
        *deepClone<NameSyntax>(*node.baseName, alloc),
        node.arguments ? deepClone(*node.arguments, alloc) : nullptr,
        node.defaultedArg ? deepClone(*node.defaultedArg, alloc) : nullptr
    );
}